

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96.c
# Opt level: O0

size_t bign96Sign2_deep(size_t n,size_t f_deep,size_t ec_d,size_t ec_deep)

{
  size_t sVar1;
  size_t sVar2;
  size_t ec_deep_00;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t in_RDI;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  sVar1 = beltHash_keep();
  sVar2 = beltHash_keep();
  ec_deep_00 = beltWBL_keep();
  sVar3 = ecMulA_deep(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,ec_deep_00,sVar2);
  sVar4 = zzMul_deep(2,in_RDI);
  sVar5 = zzMod_deep(in_RDI + 2,in_RDI);
  sVar2 = utilMax(6,sVar2,0x20,ec_deep_00,sVar3,sVar4,sVar5);
  return (in_RDI * 3 + 4) * 8 + sVar1 + sVar2;
}

Assistant:

static size_t bign96Sign2_deep(size_t n, size_t f_deep, size_t ec_d,
	size_t ec_deep)
{
	return O_OF_W(3 * n + 2 * W_OF_O(13)) +
		beltHash_keep() +
		utilMax(6,
			beltHash_keep(),
			32,
			beltKWP_keep(),
			ecMulA_deep(n, ec_d, ec_deep, n),
			zzMul_deep(W_OF_O(13), n),
			zzMod_deep(n + W_OF_O(13), n));
}